

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  short *psVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  
  uVar13 = 0xb;
  if (tableLog != 0) {
    uVar13 = (ulong)tableLog;
  }
  uVar19 = (uint)uVar13;
  sVar7 = 0xffffffffffffffff;
  if ((4 < uVar19) && (sVar7 = 0xffffffffffffffd4, uVar19 < 0xd)) {
    uVar10 = 0x1f;
    if ((uint)total != 0) {
      for (; (uint)total >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar5 = (uVar10 ^ 0xffffffe0) + 0x21;
    uVar10 = 0x1f;
    if (maxSymbolValue != 0) {
      for (; maxSymbolValue >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar10 = (uVar10 ^ 0xffffffe0) + 0x22;
    if (uVar5 < uVar10) {
      uVar10 = uVar5;
    }
    sVar7 = 0xffffffffffffffff;
    if (uVar10 <= uVar19) {
      bVar3 = (byte)uVar13;
      cVar2 = -bVar3;
      bVar8 = cVar2 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total;
      uVar10 = 1 << (bVar3 & 0x1f);
      uVar14 = 0;
      uVar6 = 0;
      uVar5 = 0;
      uVar19 = uVar10;
      do {
        uVar18 = (ulong)uVar5;
        uVar12 = (ulong)count[uVar18];
        if (uVar12 == total) {
          return 0;
        }
        uVar15 = (uint)(total >> (bVar3 & 0x3f));
        if (uVar12 == 0) {
          normalizedCounter[uVar18] = 0;
        }
        else if (uVar15 < count[uVar18]) {
          uVar12 = uVar12 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
          uVar17 = uVar12 >> (bVar8 & 0x3f);
          if ((uVar17 & 0xfff8) == 0) {
            uVar17 = (ulong)((int)uVar17 +
                            (uint)((ulong)FSE_normalizeCount::rtbTable[uVar17 & 0xffff] <<
                                   (cVar2 + 0x2aU & 0x3f) <
                                  uVar12 - ((uVar17 & 0xffff) << (bVar8 & 0x3f))));
          }
          uVar9 = (ushort)uVar17;
          if ((ushort)uVar14 < uVar9) {
            uVar6 = uVar18;
          }
          if ((ushort)uVar14 < uVar9) {
            uVar14 = uVar17 & 0xffff;
          }
          normalizedCounter[uVar18] = uVar9;
          uVar19 = uVar19 - (int)(uVar17 & 0xffff);
        }
        else {
          normalizedCounter[uVar18] = -1;
          uVar19 = uVar19 - 1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 <= maxSymbolValue);
      sVar4 = normalizedCounter[uVar6];
      iVar16 = (int)sVar4 >> 1;
      if (iVar16 == -uVar19 || SBORROW4(iVar16,-uVar19) != (int)(iVar16 + uVar19) < 0) {
        uVar12 = total * 3 >> (bVar3 + 1 & 0x3f);
        uVar14 = (ulong)(maxSymbolValue + 1);
        uVar6 = 0;
        uVar5 = 0;
        do {
          uVar19 = count[uVar6];
          if ((ulong)uVar19 == 0) {
            normalizedCounter[uVar6] = 0;
          }
          else {
            if (uVar15 < uVar19) {
              if ((uint)uVar12 < uVar19) {
                normalizedCounter[uVar6] = -2;
                goto LAB_004b5c2c;
              }
              normalizedCounter[uVar6] = 1;
            }
            else {
              normalizedCounter[uVar6] = -1;
            }
            uVar5 = uVar5 + 1;
            total = total - uVar19;
          }
LAB_004b5c2c:
          uVar6 = uVar6 + 1;
        } while (uVar14 != uVar6);
        uVar19 = uVar10 - uVar5;
        if (uVar19 == 0) {
          return uVar13;
        }
        if ((uVar12 & 0xffffffff) < total / uVar19) {
          uVar6 = total * 3;
          uVar12 = 0;
          do {
            if ((normalizedCounter[uVar12] == -2) &&
               (uVar15 = count[uVar12], uVar15 <= (uint)(uVar6 / (uVar19 * 2)))) {
              normalizedCounter[uVar12] = 1;
              uVar5 = uVar5 + 1;
              total = total - uVar15;
            }
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
          uVar19 = uVar10 - uVar5;
        }
        if (uVar5 != maxSymbolValue + 1) {
          if (total == 0) {
            if (uVar19 == 0) {
              return uVar13;
            }
            uVar6 = 0;
            do {
              if (0 < normalizedCounter[uVar6]) {
                uVar19 = uVar19 - 1;
                normalizedCounter[uVar6] = normalizedCounter[uVar6] + 1;
              }
              uVar10 = (uint)uVar6;
              uVar6 = (ulong)(uVar10 + 1);
              if (uVar10 == maxSymbolValue) {
                uVar6 = 0;
              }
            } while (uVar19 != 0);
            return uVar13;
          }
          uVar14 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
          uVar10 = 0;
          uVar6 = uVar14;
          do {
            uVar12 = uVar6;
            if (normalizedCounter[uVar10] == -2) {
              uVar12 = (ulong)count[uVar10] * ((((ulong)uVar19 << (bVar8 & 0x3f)) + uVar14) / total)
                       + uVar6;
              uVar6 = uVar6 >> (bVar8 & 0x3f);
              uVar18 = uVar12 >> (bVar8 & 0x3f);
              if (uVar18 == uVar6) {
                return 0xffffffffffffffff;
              }
              normalizedCounter[uVar10] = (short)uVar18 - (short)uVar6;
            }
            uVar10 = uVar10 + 1;
            uVar6 = uVar12;
          } while (uVar10 <= maxSymbolValue);
          return uVar13;
        }
        uVar12 = 0;
        uVar10 = 0;
        uVar6 = 0;
        do {
          if (uVar10 < count[uVar12]) {
            uVar6 = uVar12 & 0xffffffff;
            uVar10 = count[uVar12];
          }
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
        psVar11 = normalizedCounter + uVar6;
        sVar4 = *psVar11;
      }
      else {
        psVar11 = normalizedCounter + uVar6;
      }
      *psVar11 = sVar4 + (short)uVar19;
      sVar7 = uVar13;
    }
  }
  return sVar7;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}